

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

string * embree::stringOfCPUFeatures_abi_cxx11_(int features)

{
  uint in_ESI;
  string *in_RDI;
  string *str;
  
  std::__cxx11::string::string((string *)in_RDI);
  if ((in_ESI & 0x2000000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"XMM ");
  }
  if ((in_ESI & 0x4000000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"YMM ");
  }
  if ((in_ESI & 0x8000000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"ZMM ");
  }
  if ((in_ESI & 1) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE ");
  }
  if ((in_ESI & 2) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE2 ");
  }
  if ((in_ESI & 4) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE3 ");
  }
  if ((in_ESI & 8) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSSE3 ");
  }
  if ((in_ESI & 0x10) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE4.1 ");
  }
  if ((in_ESI & 0x20) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE4.2 ");
  }
  if ((in_ESI & 0x40) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"POPCNT ");
  }
  if ((in_ESI & 0x80) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX ");
  }
  if ((in_ESI & 0x100) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"F16C ");
  }
  if ((in_ESI & 0x200) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"RDRAND ");
  }
  if ((in_ESI & 0x400) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX2 ");
  }
  if ((in_ESI & 0x800) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"FMA3 ");
  }
  if ((in_ESI & 0x1000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"LZCNT ");
  }
  if ((in_ESI & 0x2000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"BMI1 ");
  }
  if ((in_ESI & 0x4000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"BMI2 ");
  }
  if ((in_ESI & 0x10000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512F ");
  }
  if ((in_ESI & 0x20000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512DQ ");
  }
  if ((in_ESI & 0x40000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512PF ");
  }
  if ((in_ESI & 0x80000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512ER ");
  }
  if ((in_ESI & 0x100000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512CD ");
  }
  if ((in_ESI & 0x200000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512BW ");
  }
  if ((in_ESI & 0x400000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512VL ");
  }
  if ((in_ESI & 0x800000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512IFMA ");
  }
  if ((in_ESI & 0x1000000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512VBMI ");
  }
  if ((in_ESI & 0x10000000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"NEON ");
  }
  if ((in_ESI & 0x20000000) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"2xNEON ");
  }
  return in_RDI;
}

Assistant:

std::string stringOfCPUFeatures(int features)
  {
    std::string str;
    if (features & CPU_FEATURE_XMM_ENABLED) str += "XMM ";
    if (features & CPU_FEATURE_YMM_ENABLED) str += "YMM ";
    if (features & CPU_FEATURE_ZMM_ENABLED) str += "ZMM ";
    if (features & CPU_FEATURE_SSE   ) str += "SSE ";
    if (features & CPU_FEATURE_SSE2  ) str += "SSE2 ";
    if (features & CPU_FEATURE_SSE3  ) str += "SSE3 ";
    if (features & CPU_FEATURE_SSSE3 ) str += "SSSE3 ";
    if (features & CPU_FEATURE_SSE41 ) str += "SSE4.1 ";
    if (features & CPU_FEATURE_SSE42 ) str += "SSE4.2 ";
    if (features & CPU_FEATURE_POPCNT) str += "POPCNT ";
    if (features & CPU_FEATURE_AVX   ) str += "AVX ";
    if (features & CPU_FEATURE_F16C  ) str += "F16C ";
    if (features & CPU_FEATURE_RDRAND) str += "RDRAND ";
    if (features & CPU_FEATURE_AVX2  ) str += "AVX2 ";
    if (features & CPU_FEATURE_FMA3  ) str += "FMA3 ";
    if (features & CPU_FEATURE_LZCNT ) str += "LZCNT ";
    if (features & CPU_FEATURE_BMI1  ) str += "BMI1 ";
    if (features & CPU_FEATURE_BMI2  ) str += "BMI2 ";
    if (features & CPU_FEATURE_AVX512F) str += "AVX512F ";
    if (features & CPU_FEATURE_AVX512DQ) str += "AVX512DQ ";
    if (features & CPU_FEATURE_AVX512PF) str += "AVX512PF ";
    if (features & CPU_FEATURE_AVX512ER) str += "AVX512ER ";
    if (features & CPU_FEATURE_AVX512CD) str += "AVX512CD ";
    if (features & CPU_FEATURE_AVX512BW) str += "AVX512BW ";
    if (features & CPU_FEATURE_AVX512VL) str += "AVX512VL ";
    if (features & CPU_FEATURE_AVX512IFMA) str += "AVX512IFMA ";
    if (features & CPU_FEATURE_AVX512VBMI) str += "AVX512VBMI ";
    if (features & CPU_FEATURE_NEON) str += "NEON ";
    if (features & CPU_FEATURE_NEON_2X) str += "2xNEON ";
    return str;
  }